

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_writer.c
# Opt level: O2

rfc5444_writer_message *
rfc5444_writer_register_message(rfc5444_writer *writer,uint8_t msgid,_Bool if_specific)

{
  rfc5444_writer_message *prVar1;
  
  if (writer->_state == RFC5444_WRITER_NONE) {
    prVar1 = _get_message(writer,msgid);
    if ((prVar1 == (rfc5444_writer_message *)0x0) || (prVar1->_registered != false)) {
      prVar1 = (rfc5444_writer_message *)0x0;
    }
    else {
      prVar1->_registered = true;
      prVar1->target_specific = if_specific;
    }
    return prVar1;
  }
  __assert_fail("writer->_state == RFC5444_WRITER_NONE",
                "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/librfc5444/rfc5444_writer.c"
                ,0x192,
                "struct rfc5444_writer_message *rfc5444_writer_register_message(struct rfc5444_writer *, uint8_t, _Bool)"
               );
}

Assistant:

struct rfc5444_writer_message *
rfc5444_writer_register_message(struct rfc5444_writer *writer, uint8_t msgid, bool if_specific) {
  struct rfc5444_writer_message *msg;

#if WRITER_STATE_MACHINE == true
  assert(writer->_state == RFC5444_WRITER_NONE);
#endif

  msg = _get_message(writer, msgid);
  if (msg == NULL) {
    /* out of memory error */
    return NULL;
  }

  if (msg->_registered) {
    /* message was already _registered */
    return NULL;
  }

  /* mark message as _registered */
  msg->_registered = true;

  /* set target_specific flag */
  msg->target_specific = if_specific;
  return msg;
}